

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

void __thiscall
crnlib::
hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
::move_into(hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
            *this,node *pNode)

{
  raw_node *prVar1;
  undefined8 uVar2;
  uint uVar3;
  raw_node *prVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar3 = (uint)((int)(pNode->super_value_type).first * -0x61c88647) >>
          ((byte)this->m_hash_shift & 0x1f);
  prVar1 = (this->m_values).m_p;
  prVar4 = prVar1 + uVar3;
  if (prVar1[uVar3].m_bits[0xc] != '\0') {
    uVar5 = (this->m_values).m_size - 1;
    uVar7 = uVar3;
    do {
      uVar6 = uVar7 - 1;
      if (uVar7 == 0) {
        uVar6 = uVar5;
      }
      if (uVar6 == uVar3) {
        return;
      }
      prVar4 = prVar4 + -1;
      if (uVar7 == 0) {
        prVar4 = prVar1 + uVar5;
      }
      uVar7 = uVar6;
    } while (prVar4->m_bits[0xc] != '\0');
  }
  uVar2 = *(undefined8 *)&(pNode->super_value_type).second;
  *(unsigned_long_long *)prVar4->m_bits = (pNode->super_value_type).first;
  *(undefined8 *)(prVar4->m_bits + 8) = uVar2;
  (pNode->super_value_type).field_0xc = 0;
  this->m_num_valid = this->m_num_valid + 1;
  return;
}

Assistant:

inline int hash_key(const Key& k) const {
    CRNLIB_ASSERT((1U << (32U - m_hash_shift)) == m_values.size());

    uint hash = static_cast<uint>(m_hasher(k));

    // Fibonacci hashing
    hash = (2654435769U * hash) >> m_hash_shift;

    CRNLIB_ASSERT(hash < m_values.size());
    return hash;
  }